

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O2

void slang::signExtend(uint64_t *input,uint32_t numWords,uint32_t word,uint32_t bit,
                      uint64_t topWordMask)

{
  ulong uVar1;
  uint64_t uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = (ulong)word;
  if ((input[uVar1] >> ((ulong)bit & 0x3f) & 1) != 0) {
    uVar3 = numWords - 1;
    if (word < uVar3) {
      input[uVar3] = topWordMask;
      uVar3 = numWords - 2;
      topWordMask = 0xffffffffffffffff;
    }
    for (uVar4 = (ulong)uVar3; uVar1 < uVar4; uVar4 = uVar4 - 1) {
      input[uVar4] = 0xffffffffffffffff;
    }
    uVar2 = 0xffffffffffffffff;
    if (uVar3 == word) {
      uVar2 = topWordMask;
    }
    input[uVar1] = input[uVar1] | (uVar2 >> ((byte)bit & 0x3f)) << ((byte)bit & 0x3f);
  }
  return;
}

Assistant:

static void signExtend(uint64_t* input, uint32_t numWords, uint32_t word, uint32_t bit,
                       uint64_t topWordMask) {
    if ((input[word] & (1ULL << bit)) == 0)
        return; // If word.bit is zero, don't change anything.

    if (numWords - 1 > word) {
        input[numWords - 1] = topWordMask;
        numWords--;
        topWordMask = UINT64_MAX;
    }

    uint64_t mask = UINT64_MAX;
    for (auto i = numWords - 1; i > word; i--)
        input[i] = mask;

    mask <<= bit;
    if (numWords - 1 == word)
        mask &= topWordMask;
    input[word] |= mask;
}